

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall
SQNativeClosure::SQNativeClosure(SQNativeClosure *this,SQSharedState *ss,SQFUNCTION func)

{
  SQFUNCTION func_local;
  SQSharedState *ss_local;
  SQNativeClosure *this_local;
  
  SQCollectable::SQCollectable(&this->super_SQCollectable);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQNativeClosure_001602a8;
  sqvector<long_long>::sqvector(&this->_typecheck);
  ::SQObjectPtr::SQObjectPtr(&this->_name);
  this->_function = func;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain
            (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this);
  this->_env = (SQWeakRef *)0x0;
  return;
}

Assistant:

SQNativeClosure(SQSharedState *ss,SQFUNCTION func){_function=func;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this); _env = NULL;}